

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * validateInnerProductWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  size_type *psVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  string *layerName;
  uint uVar7;
  char cVar8;
  byte bVar9;
  bool bVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  undefined7 extraout_var;
  undefined8 *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  undefined7 extraout_var_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_04;
  byte bVar14;
  ulong *puVar15;
  ulong uVar16;
  byte bVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char cVar19;
  uint uVar20;
  undefined8 uVar21;
  ulong uVar22;
  unsigned_long uVar23;
  byte bVar24;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string layer_type;
  string __str_3;
  string __str_2;
  string local_230;
  unsigned_long local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  ulong *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  ulong local_e8 [2];
  ulong *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  uVar20 = layer->_oneof_case_[0];
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)uVar20;
  if (uVar20 == 0x415) {
    pCVar3 = (layer->layer_).convolution_;
    local_1c8 = *(ulong *)&pCVar3->_kernelsize_cached_byte_size_;
    local_210._0_4_ = (pCVar3->stride_).current_size_;
    local_210._4_4_ = (pCVar3->stride_).total_size_;
    bVar17 = *(byte *)((long)&(pCVar3->stride_).rep_ + 2);
    std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,0x31a5e2);
  }
  else {
    if (uVar20 != 0x8c) goto LAB_002ba0a9;
    pCVar3 = (layer->layer_).convolution_;
    local_1c8 = *(ulong *)&pCVar3->_kernelsize_cached_byte_size_;
    local_210._0_4_ = (pCVar3->stride_).current_size_;
    local_210._4_4_ = (pCVar3->stride_).total_size_;
    bVar17 = *(byte *)&(pCVar3->stride_).rep_;
    std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,0x31b6ab);
  }
  iVar2 = (weights->floatvalue_).current_size_;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(long)iVar2;
  uVar16 = ((weights->float16value_).ptr_)->_M_string_length;
  uVar20 = (0 < (long)paVar11) + 1;
  if (uVar16 == 0) {
    uVar20 = (uint)(0 < (long)paVar11);
  }
  sVar4 = ((weights->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((weights->int8rawvalue_).ptr_)->_M_string_length;
  uVar7 = (uint)(sVar5 == 0);
  uVar20 = (uVar20 - (sVar4 == 0)) + 2;
  bVar24 = 4;
  bVar14 = 4;
  if (uVar20 - uVar7 < 2) {
    bVar14 = 5;
    if (uVar20 != uVar7) {
      bVar14 = iVar2 < 1;
    }
    if (((((uVar16 == 0) && (iVar2 < 1)) && (uVar20 != uVar7)) &&
        (((sVar4 == 0 ||
          (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar14 = 2, weights->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 ||
         (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (bVar14 = 3, weights->quantization_ == (QuantizationParams *)0x0)))) {
      bVar14 = 5;
    }
  }
  iVar2 = (bias->floatvalue_).current_size_;
  sVar4 = ((bias->float16value_).ptr_)->_M_string_length;
  uVar20 = (0 < iVar2) + 1;
  if (sVar4 == 0) {
    uVar20 = (uint)(0 < iVar2);
  }
  sVar5 = ((bias->rawvalue_).ptr_)->_M_string_length;
  sVar6 = ((bias->int8rawvalue_).ptr_)->_M_string_length;
  uVar7 = (uint)(sVar6 == 0);
  uVar20 = (uVar20 - (sVar5 == 0)) + 2;
  if (uVar20 - uVar7 < 2) {
    bVar24 = 5;
    if (uVar20 != uVar7) {
      bVar24 = iVar2 < 1;
    }
    if ((((sVar4 == 0) && (iVar2 < 1)) && (uVar20 != uVar7)) &&
       ((((sVar5 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar24 = 2, bias->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar6 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar24 = 3, bias->quantization_ == (QuantizationParams *)0x0)))))) {
      bVar24 = 5;
    }
  }
  if ((bVar14 == 4) || ((bVar24 == 4 & bVar17) != 0)) {
    local_208._M_allocated_capacity = (size_type)&local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
    std::__cxx11::string::append(local_208._M_local_buf);
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append
                        (local_208._M_local_buf,(ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar11) {
      local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1e8.field_2._8_8_ = puVar13[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1e8._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1e8._M_string_length = puVar13[1];
    *puVar13 = paVar11;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar11) {
      local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_230.field_2._8_8_ = plVar12[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_230._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_230._M_string_length = plVar12[1];
    *plVar12 = (long)paVar11;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
LAB_002ba024:
    __return_storage_ptr__->m_type = local_1c0._0_4_;
    __return_storage_ptr__->m_reason = local_1c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1b0 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != paVar11) {
      operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
      paVar11 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      paVar11 = extraout_RAX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
      paVar11 = extraout_RAX_01;
    }
    local_50.field_2._M_allocated_capacity = local_1f8._M_allocated_capacity;
    local_50._M_dataplus._M_p = (pointer)local_208._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_allocated_capacity == &local_1f8) goto LAB_002ba0a9;
  }
  else {
    if ((bVar17 != 0) && (((bVar14 == 1 && (bVar24 == 0)) || ((bVar14 == 0 && (bVar24 == 1)))))) {
      local_208._M_allocated_capacity = (size_type)&local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      std::__cxx11::string::append(local_208._M_local_buf);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  (local_208._M_local_buf,
                                   (ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar11) {
        local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1e8.field_2._8_8_ = plVar12[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1e8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_1e8._M_string_length = plVar12[1];
      *plVar12 = (long)paVar11;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar11) {
        local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_230.field_2._8_8_ = puVar13[3];
      }
      else {
        local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_230._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_230._M_string_length = puVar13[1];
      *puVar13 = paVar11;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      goto LAB_002ba024;
    }
    bVar9 = bVar17;
    if (bVar14 < 2) {
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar16 >> 1);
      if (bVar14 == 0) {
        paVar18 = paVar11;
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1c8 * local_210);
      if ((long)paVar11 - (long)paVar18 == 0) goto LAB_002b9f69;
      std::operator+(&local_50,"Layer \'",(layer->name_).ptr_);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar15 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar15) {
        local_a8 = *puVar15;
        lStack_a0 = plVar12[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar15;
        local_b8 = (ulong *)*plVar12;
      }
      local_b0 = plVar12[1];
      *plVar12 = (long)puVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cVar19 = '\x01';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x9 < paVar18) {
        paVar11 = paVar18;
        cVar8 = '\x04';
        do {
          cVar19 = cVar8;
          if (paVar11 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x64) {
            cVar19 = cVar19 + -2;
            goto LAB_002ba50a;
          }
          if (paVar11 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x3e8) {
            cVar19 = cVar19 + -1;
            goto LAB_002ba50a;
          }
          if (paVar11 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x2710) goto LAB_002ba50a;
          bVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1869f < paVar11;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)paVar11 / 10000);
          cVar8 = cVar19 + '\x04';
        } while (bVar10);
        cVar19 = cVar19 + '\x01';
      }
LAB_002ba50a:
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct((ulong)&local_d8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_d8,local_d0,(unsigned_long)paVar18);
      uVar16 = CONCAT44(uStack_cc,local_d0) + local_b0;
      uVar22 = 0xf;
      if (local_b8 != &local_a8) {
        uVar22 = local_a8;
      }
      if (uVar22 < uVar16) {
        uVar22 = 0xf;
        if (local_d8 != local_c8) {
          uVar22 = local_c8[0];
        }
        if (uVar22 < uVar16) goto LAB_002ba590;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_002ba590:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
      }
      local_98 = &local_88;
      plVar12 = puVar13 + 2;
      if ((long *)*puVar13 == plVar12) {
        local_88 = *plVar12;
        uStack_80 = puVar13[3];
      }
      else {
        local_88 = *plVar12;
        local_98 = (long *)*puVar13;
      }
      local_90 = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)plVar12 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_98);
      paVar11 = &local_118.field_2;
      puVar15 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_118.field_2._M_allocated_capacity = *puVar15;
        local_118.field_2._8_8_ = plVar12[3];
        local_118._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar15;
        local_118._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_118._M_string_length = plVar12[1];
      *plVar12 = (long)puVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cVar19 = '\x01';
      if (9 < local_1c8) {
        uVar16 = local_1c8;
        cVar8 = '\x04';
        do {
          cVar19 = cVar8;
          if (uVar16 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_002ba6cd;
          }
          if (uVar16 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_002ba6cd;
          }
          if (uVar16 < 10000) goto LAB_002ba6cd;
          bVar10 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar8 = cVar19 + '\x04';
        } while (bVar10);
        cVar19 = cVar19 + '\x01';
      }
LAB_002ba6cd:
      local_78 = local_68;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,local_1c8);
      uVar16 = CONCAT44(uStack_6c,local_70) + local_118._M_string_length;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar11) {
        uVar21 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < uVar16) {
        uVar22 = 0xf;
        if (local_78 != local_68) {
          uVar22 = local_68[0];
        }
        if (uVar22 < uVar16) goto LAB_002ba759;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_78,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
      }
      else {
LAB_002ba759:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_78);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar1 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_138.field_2._M_allocated_capacity = *psVar1;
        local_138.field_2._8_8_ = puVar13[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar1;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = psVar1;
      puVar13[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_138);
      puVar15 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_158.field_2._M_allocated_capacity = *puVar15;
        local_158.field_2._8_8_ = plVar12[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *puVar15;
        local_158._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_158._M_string_length = plVar12[1];
      *plVar12 = (long)puVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cVar19 = '\x01';
      if (9 < local_210) {
        uVar23 = local_210;
        cVar8 = '\x04';
        do {
          cVar19 = cVar8;
          if (uVar23 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_002ba88f;
          }
          if (uVar23 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_002ba88f;
          }
          if (uVar23 < 10000) goto LAB_002ba88f;
          bVar10 = 99999 < uVar23;
          uVar23 = uVar23 / 10000;
          cVar8 = cVar19 + '\x04';
        } while (bVar10);
        cVar19 = cVar19 + '\x01';
      }
LAB_002ba88f:
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct((ulong)&local_f8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f8,local_f0,local_210);
      uVar16 = CONCAT44(uStack_ec,local_f0) + local_158._M_string_length;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        uVar21 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < uVar16) {
        uVar22 = 0xf;
        if (local_f8 != local_e8) {
          uVar22 = local_e8[0];
        }
        if (uVar22 < uVar16) goto LAB_002ba917;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_f8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      }
      else {
LAB_002ba917:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      plVar12 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_198.field_2._M_allocated_capacity = *plVar12;
        local_198.field_2._8_8_ = puVar13[3];
      }
      else {
        local_198.field_2._M_allocated_capacity = *plVar12;
        local_198._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_198._M_string_length = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)plVar12 = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar18) {
        local_1f8._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1f8._8_8_ = puVar13[3];
        local_208._M_allocated_capacity = (size_type)&local_1f8;
      }
      else {
        local_1f8._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_208._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar13;
      }
      local_208._8_8_ = puVar13[1];
      *puVar13 = paVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          (local_208._M_local_buf,(ulong)local_178._M_dataplus._M_p);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar18) {
        local_1e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1e8.field_2._8_8_ = puVar13[3];
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1e8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_1e8._M_string_length = puVar13[1];
      *puVar13 = paVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar18) {
        local_230.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_230.field_2._8_8_ = puVar13[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_230._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_230._M_string_length = puVar13[1];
      *puVar13 = paVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      __return_storage_ptr__->m_type = local_1c0._0_4_;
      __return_storage_ptr__->m_reason = local_1c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1b0 + 8)) {
        operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_allocated_capacity != &local_1f8) {
        operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._0_8_ + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar11) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      paVar11 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar11) goto LAB_002ba0a9;
    }
    else {
      if (bVar14 == 2) {
        local_58 = (layer->name_).ptr_;
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"weight","");
        CoreML::validateGeneralWeightParams
                  ((Result *)local_1c0,weights,local_1c8 * local_210,local_210,&local_178,local_58,
                   &local_230);
        __return_storage_ptr__->m_type = local_1c0._0_4_;
        __return_storage_ptr__->m_reason = local_1c0._4_4_;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1b0 + 8)) {
          operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        bVar9 = CoreML::Result::good(__return_storage_ptr__);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var,bVar9);
      }
LAB_002b9f69:
      if ((bVar17 & bVar9) == 0) goto LAB_002ba0a9;
      if (1 < bVar24) {
        if (bVar24 == 2) {
          layerName = (layer->name_).ptr_;
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"bias","");
          CoreML::validateGeneralWeightParams
                    ((Result *)local_1c0,bias,local_210,1,&local_178,layerName,&local_230);
          __return_storage_ptr__->m_type = local_1c0._0_4_;
          __return_storage_ptr__->m_reason = local_1c0._4_4_;
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1b0 + 8)) {
            operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          bVar10 = CoreML::Result::good(__return_storage_ptr__);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(extraout_var_00,bVar10);
        }
        goto LAB_002ba0a9;
      }
      if (bVar24 == 0) {
        uVar23 = (unsigned_long)(bias->floatvalue_).current_size_;
      }
      else {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(bias->float16value_).ptr_;
        uVar23 = (ulong)(((string *)(paVar11->_M_local_buf + 8))->_M_dataplus)._M_p >> 1;
      }
      if (uVar23 == local_210) goto LAB_002ba0a9;
      std::operator+(&local_158,"Layer \'",(layer->name_).ptr_);
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
      plVar12 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_198.field_2._M_allocated_capacity = *plVar12;
        local_198.field_2._8_8_ = puVar13[3];
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = *plVar12;
        local_198._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_198._M_string_length = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::to_string(&local_138,uVar23);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,&local_198,&local_138);
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_208._M_local_buf);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar11) {
        local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1e8.field_2._8_8_ = puVar13[3];
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1e8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_1e8._M_string_length = puVar13[1];
      *puVar13 = paVar11;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::to_string(&local_118,local_210);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                     &local_1e8,&local_118);
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_1c0);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 == paVar11) {
        local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_230.field_2._8_8_ = puVar13[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_230._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_230._M_string_length = puVar13[1];
      *puVar13 = paVar11;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0,local_1b0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_allocated_capacity != &local_1f8) {
        operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      __return_storage_ptr__->m_type = local_1c0._0_4_;
      __return_storage_ptr__->m_reason = local_1c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1b0 + 8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != paVar11) {
        operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
        paVar11 = extraout_RAX_04;
      }
      local_50.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == &local_230.field_2) goto LAB_002ba0a9;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  paVar11 = extraout_RAX_02;
LAB_002ba0a9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
    paVar11 = extraout_RAX_03;
  }
  return (Result *)paVar11;
}

Assistant:

static Result validateInnerProductWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t num_inputs;
    uint64_t num_outputs;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct: {
            const auto& params = layer.innerproduct();
            num_inputs = params.inputchannels();
            num_outputs = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Inner product";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kBatchedMatmul: {
            const auto& params = layer.batchedmatmul();
            num_inputs = params.weightmatrixfirstdimension();
            num_outputs = params.weightmatrixseconddimension();
            has_bias = params.hasbias();
            layer_type = "BatchedMatMul";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Check for weight and bias value type
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() + "' has invalid weights/bias fields.");
        return r;
    }
    // Check that weight and bias should both be FP16/32, or quantized
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Check weights
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16){
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(weights.floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(weights.float16value().size() / 2);
        }
        if (num_inputs * num_outputs != weight_size) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layer.name() +
                       " has incorrect weight matrix size " + std::to_string(weight_size) +
                       " to encode a " + std::to_string(num_inputs) + " × " +
                       std::to_string(num_outputs) + " " + layer_type + ".");
            return r;
        }
    } else if (weightsValueType == QUINT){
        r = validateGeneralWeightParams(weights, num_inputs * num_outputs, num_outputs,
                                        layer_type, layer.name(), "weight");
        if (!r.good()) return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias){
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(bias.floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(bias.float16value().size() / 2);
            }
            if (bias_size != num_outputs) {
                std::string err = "Layer '" + layer.name() + "' has incorrect bias vector size " +
                std::to_string(bias_size) + " (expected " + std::to_string(num_outputs) + ").";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            r = validateGeneralWeightParams(bias, num_outputs, 1, layer_type,
                                            layer.name(), "bias");
            if (!r.good()) return r;
        }
    } else if (!has_bias && bias_size > 0) {
        std::string err = "Bias vector being ignored since \"hasBias\" flag not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}